

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O0

FxExpression * ParseExpressionM(FScanner *sc,PClassActor *cls)

{
  bool bVar1;
  FScanner *pFVar2;
  FxAssignSelf *pFVar3;
  FxExpression *pFVar4;
  FxExpression *pFVar5;
  size_t size;
  FScriptPosition *pos;
  FxAssign *ret;
  FScriptPosition local_70;
  FxAssignSelf *local_60;
  FxAssignSelf *left;
  FxBinary *exp;
  FxExpression *right;
  FxExpression *local_38;
  FxExpression *falsex;
  FxExpression *truex;
  FxExpression *base;
  PClassActor *cls_local;
  FScanner *sc_local;
  
  base = (FxExpression *)cls;
  cls_local = (PClassActor *)sc;
  truex = ParseExpressionL(sc,cls);
  bVar1 = FScanner::CheckToken((FScanner *)cls_local,0x3f);
  if (bVar1) {
    falsex = ParseExpressionM((FScanner *)cls_local,(PClassActor *)base);
    FScanner::MustGetToken((FScanner *)cls_local,0x3a);
    pFVar5 = base;
    local_38 = ParseExpressionM((FScanner *)cls_local,(PClassActor *)base);
    pFVar2 = (FScanner *)FxExpression::operator_new((FxExpression *)0x40,(size_t)pFVar5);
    FxConditional::FxConditional((FxConditional *)pFVar2,truex,falsex,local_38);
    sc_local = pFVar2;
  }
  else {
    size = 0x3d;
    bVar1 = FScanner::CheckToken((FScanner *)cls_local,0x3d);
    if (bVar1) {
      pFVar5 = base;
      exp = (FxBinary *)ParseExpressionM((FScanner *)cls_local,(PClassActor *)base);
      pFVar2 = (FScanner *)FxExpression::operator_new((FxExpression *)0x48,(size_t)pFVar5);
      FxAssign::FxAssign((FxAssign *)pFVar2,truex,&exp->super_FxExpression,false);
      sc_local = pFVar2;
    }
    else {
      pFVar3 = (FxAssignSelf *)FxExpression::operator_new((FxExpression *)0x30,size);
      FScriptPosition::FScriptPosition(&local_70,(FScanner *)cls_local);
      pos = &local_70;
      FxAssignSelf::FxAssignSelf(pFVar3,pos);
      FScriptPosition::~FScriptPosition(&local_70);
      local_60 = pFVar3;
      FScanner::GetToken((FScanner *)cls_local);
      switch(*(undefined4 *)
              ((long)&(cls_local->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                      super_PCompoundType.super_PType.super_PTypeBase.super_DObject.Class + 4)) {
      case 0x10b:
        pFVar3 = (FxAssignSelf *)FxExpression::operator_new((FxExpression *)0x40,(size_t)pos);
        FxShift::FxShift((FxShift *)pFVar3,0x116,&local_60->super_FxExpression,(FxExpression *)0x0);
        left = pFVar3;
        break;
      case 0x10c:
        pFVar3 = (FxAssignSelf *)FxExpression::operator_new((FxExpression *)0x40,(size_t)pos);
        FxShift::FxShift((FxShift *)pFVar3,0x117,&local_60->super_FxExpression,(FxExpression *)0x0);
        left = pFVar3;
        break;
      case 0x10d:
        pFVar3 = (FxAssignSelf *)FxExpression::operator_new((FxExpression *)0x40,(size_t)pos);
        FxShift::FxShift((FxShift *)pFVar3,0x118,&local_60->super_FxExpression,(FxExpression *)0x0);
        left = pFVar3;
        break;
      case 0x10e:
        pFVar3 = (FxAssignSelf *)FxExpression::operator_new((FxExpression *)0x40,(size_t)pos);
        FxAddSub::FxAddSub((FxAddSub *)pFVar3,0x2b,&local_60->super_FxExpression,(FxExpression *)0x0
                          );
        left = pFVar3;
        break;
      case 0x10f:
        pFVar3 = (FxAssignSelf *)FxExpression::operator_new((FxExpression *)0x40,(size_t)pos);
        FxAddSub::FxAddSub((FxAddSub *)pFVar3,0x2d,&local_60->super_FxExpression,(FxExpression *)0x0
                          );
        left = pFVar3;
        break;
      case 0x110:
        pFVar3 = (FxAssignSelf *)FxExpression::operator_new((FxExpression *)0x40,(size_t)pos);
        FxMulDiv::FxMulDiv((FxMulDiv *)pFVar3,0x2a,&local_60->super_FxExpression,(FxExpression *)0x0
                          );
        left = pFVar3;
        break;
      case 0x111:
        pFVar3 = (FxAssignSelf *)FxExpression::operator_new((FxExpression *)0x40,(size_t)pos);
        FxMulDiv::FxMulDiv((FxMulDiv *)pFVar3,0x2f,&local_60->super_FxExpression,(FxExpression *)0x0
                          );
        left = pFVar3;
        break;
      case 0x112:
        pFVar3 = (FxAssignSelf *)FxExpression::operator_new((FxExpression *)0x40,(size_t)pos);
        FxMulDiv::FxMulDiv((FxMulDiv *)pFVar3,0x25,&local_60->super_FxExpression,(FxExpression *)0x0
                          );
        left = pFVar3;
        break;
      case 0x113:
        pFVar3 = (FxAssignSelf *)FxExpression::operator_new((FxExpression *)0x40,(size_t)pos);
        FxBitOp::FxBitOp((FxBitOp *)pFVar3,0x26,&local_60->super_FxExpression,(FxExpression *)0x0);
        left = pFVar3;
        break;
      case 0x114:
        pFVar3 = (FxAssignSelf *)FxExpression::operator_new((FxExpression *)0x40,(size_t)pos);
        FxBitOp::FxBitOp((FxBitOp *)pFVar3,0x5e,&local_60->super_FxExpression,(FxExpression *)0x0);
        left = pFVar3;
        break;
      case 0x115:
        pFVar3 = (FxAssignSelf *)FxExpression::operator_new((FxExpression *)0x40,(size_t)pos);
        FxBitOp::FxBitOp((FxBitOp *)pFVar3,0x7c,&local_60->super_FxExpression,(FxExpression *)0x0);
        left = pFVar3;
        break;
      default:
        FScanner::UnGet((FScanner *)cls_local);
        if (local_60 != (FxAssignSelf *)0x0) {
          (*(local_60->super_FxExpression)._vptr_FxExpression[1])();
        }
        return truex;
      }
      pFVar5 = base;
      pFVar4 = ParseExpressionM((FScanner *)cls_local,(PClassActor *)base);
      left[1].super_FxExpression.ScriptPosition.FileName.Chars = (char *)pFVar4;
      pFVar2 = (FScanner *)FxExpression::operator_new((FxExpression *)0x48,(size_t)pFVar5);
      FxAssign::FxAssign((FxAssign *)pFVar2,truex,&left->super_FxExpression,true);
      local_60->Assignment = (FxAssign *)pFVar2;
      sc_local = pFVar2;
    }
  }
  return (FxExpression *)sc_local;
}

Assistant:

static FxExpression *ParseExpressionM (FScanner &sc, PClassActor *cls)
{
	FxExpression *base = ParseExpressionL (sc, cls);

	if (sc.CheckToken('?'))
	{
		FxExpression *truex = ParseExpressionM (sc, cls);
		sc.MustGetToken(':');
		FxExpression *falsex = ParseExpressionM (sc, cls);
		return new FxConditional(base, truex, falsex);
	}
	else if (sc.CheckToken('='))
	{
		FxExpression *right = ParseExpressionM(sc, cls);
		return new FxAssign(base, right);
	}
	else
	{
		FxBinary *exp;
		FxAssignSelf *left = new FxAssignSelf(sc);

		sc.GetToken();
		switch (sc.TokenType)
		{
		case TK_AddEq:
			exp = new FxAddSub('+', left, nullptr);
			break;

		case TK_SubEq:
			exp = new FxAddSub('-', left, nullptr);
			break;

		case TK_MulEq:
			exp = new FxMulDiv('*', left, nullptr);
			break;

		case TK_DivEq:
			exp = new FxMulDiv('/', left, nullptr);
			break;

		case TK_ModEq:
			exp = new FxMulDiv('%', left, nullptr);
			break;

		case TK_LShiftEq:
			exp = new FxShift(TK_LShift, left, nullptr);
			break;

		case TK_RShiftEq:
			exp = new FxShift(TK_RShift, left, nullptr);
			break;

		case TK_URShiftEq:
			exp = new FxShift(TK_URShift, left, nullptr);
			break;

		case TK_AndEq:
			exp = new FxBitOp('&', left, nullptr);
			break;

		case TK_XorEq:
			exp = new FxBitOp('^', left, nullptr);
			break;

		case TK_OrEq:
			exp = new FxBitOp('|', left, nullptr);
			break;

		default:
			sc.UnGet();
			delete left;
			return base;
		}

		exp->right = ParseExpressionM(sc, cls);

		FxAssign *ret = new FxAssign(base, exp, true);
		left->Assignment = ret;
		return ret;
	}
}